

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::root_matcher<pstore::exchange::import_ns::callbacks>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,root_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  maybe<char,_void> *pmVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  pointer pmVar5;
  bool local_149;
  void *local_148;
  error_code local_140;
  bool local_129;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  local_128;
  bool local_111;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  local_110;
  bool local_f9;
  matcher<pstore::exchange::import_ns::callbacks> local_f8;
  bool local_e1;
  matcher<pstore::exchange::import_ns::callbacks> local_e0;
  bool local_c9;
  matcher<pstore::exchange::import_ns::callbacks> local_c8;
  bool local_b1;
  maybe<char,_void> *local_b0;
  matcher<pstore::exchange::import_ns::callbacks> local_a8;
  bool local_91;
  matcher<pstore::exchange::import_ns::callbacks> local_90;
  error_code local_80 [2];
  bool local_59;
  matcher<pstore::exchange::import_ns::callbacks> local_58;
  bool local_41;
  void *local_40;
  error_code local_38;
  maybe<char,_void> *local_28;
  maybe<char,_void> *ch_local;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  root_matcher<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<pstore::exchange::import_ns::callbacks> *)this;
  this_local = (root_matcher<pstore::exchange::import_ns::callbacks> *)__return_storage_ptr__;
  bVar2 = maybe::operator_cast_to_bool((maybe *)ch);
  pmVar1 = ch_local;
  if (bVar2) {
    iVar3 = matcher<pstore::exchange::import_ns::callbacks>::get_state
                      (&this->super_matcher<pstore::exchange::import_ns::callbacks>);
    if (iVar3 == 1) {
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x696);
    }
    if (iVar3 == 2) {
      matcher<pstore::exchange::import_ns::callbacks>::set_state
                (&this->super_matcher<pstore::exchange::import_ns::callbacks>,3);
      matcher<pstore::exchange::import_ns::callbacks>::make_whitespace_matcher
                (&local_58,(parser<pstore::exchange::import_ns::callbacks> *)this);
      local_59 = false;
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
      ::
      pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                (__return_storage_ptr__,
                 (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                  *)&local_58,&local_59);
      std::
      unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
      ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                     *)&local_58);
    }
    else {
      if (iVar3 != 3) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x698);
      }
      if ((((this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xc & 1) != 0) &&
         (pcVar4 = maybe<char,_void>::operator*(ch), pmVar1 = ch_local, *pcVar4 != '\"')) {
        std::error_code::error_code<pstore::json::error_code,void>(local_80,expected_string);
        matcher<pstore::exchange::import_ns::callbacks>::set_error
                  (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
                   (parser<pstore::exchange::import_ns::callbacks> *)pmVar1,local_80);
      }
      matcher<pstore::exchange::import_ns::callbacks>::set_state
                (&this->super_matcher<pstore::exchange::import_ns::callbacks>,1);
      pcVar4 = maybe<char,_void>::operator*(ch);
      pmVar1 = ch_local;
      switch(*pcVar4) {
      case '\"':
        local_b0 = ch_local + 0x40;
        matcher<pstore::exchange::import_ns::callbacks>::
        make_terminal_matcher<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>,std::__cxx11::string*,bool_const&>
                  (&local_a8,(parser<pstore::exchange::import_ns::callbacks> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)ch_local,
                   (bool *)&local_b0);
        local_b1 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,
                   (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                    *)&local_a8,&local_b1);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                       *)&local_a8);
        break;
      default:
        std::error_code::error_code<pstore::json::error_code,void>(&local_140,expected_token);
        matcher<pstore::exchange::import_ns::callbacks>::set_error
                  (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
                   (parser<pstore::exchange::import_ns::callbacks> *)pmVar1,&local_140);
        local_148 = (void *)0x0;
        local_149 = true;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_148,&local_149);
        break;
      case '-':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        matcher<pstore::exchange::import_ns::callbacks>::
        make_terminal_matcher<pstore::json::details::number_matcher<pstore::exchange::import_ns::callbacks>>
                  (&local_90,(parser<pstore::exchange::import_ns::callbacks> *)this);
        local_91 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,
                   (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                    *)&local_90,&local_91);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                       *)&local_90);
        break;
      case '[':
        pmVar5 = (pointer)operator_new(0x10);
        array_matcher<pstore::exchange::import_ns::callbacks>::array_matcher
                  ((array_matcher<pstore::exchange::import_ns::callbacks> *)pmVar5);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
        ::
        unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>,void>
                  ((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
                    *)&local_110,pmVar5);
        local_111 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,&local_110,&local_111);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr(&local_110);
        break;
      case 'f':
        matcher<pstore::exchange::import_ns::callbacks>::
        make_terminal_matcher<pstore::json::details::token_matcher<pstore::exchange::import_ns::callbacks,pstore::json::details::false_complete>,char_const(&)[6]>
                  (&local_e0,(parser<pstore::exchange::import_ns::callbacks> *)this,
                   &ch_local->valid_);
        local_e1 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,
                   (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                    *)&local_e0,&local_e1);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                       *)&local_e0);
        break;
      case 'n':
        matcher<pstore::exchange::import_ns::callbacks>::
        make_terminal_matcher<pstore::json::details::token_matcher<pstore::exchange::import_ns::callbacks,pstore::json::details::null_complete>,char_const(&)[5]>
                  (&local_f8,(parser<pstore::exchange::import_ns::callbacks> *)this,
                   &ch_local->valid_);
        local_f9 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,
                   (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                    *)&local_f8,&local_f9);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                       *)&local_f8);
        break;
      case 't':
        matcher<pstore::exchange::import_ns::callbacks>::
        make_terminal_matcher<pstore::json::details::token_matcher<pstore::exchange::import_ns::callbacks,pstore::json::details::true_complete>,char_const(&)[5]>
                  (&local_c8,(parser<pstore::exchange::import_ns::callbacks> *)this,
                   &ch_local->valid_);
        local_c9 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,
                   (unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                    *)&local_c8,&local_c9);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
                       *)&local_c8);
        break;
      case '{':
        pmVar5 = (pointer)operator_new(0x10);
        object_matcher<pstore::exchange::import_ns::callbacks>::object_matcher
                  ((object_matcher<pstore::exchange::import_ns::callbacks> *)pmVar5);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
        ::
        unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>,void>
                  ((unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>
                    *)&local_128,pmVar5);
        local_129 = false;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool,_true>
                  (__return_storage_ptr__,&local_128,&local_129);
        std::
        unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
        ::~unique_ptr(&local_128);
      }
    }
  }
  else {
    std::error_code::error_code<pstore::json::error_code,void>(&local_38,expected_token);
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
               (parser<pstore::exchange::import_ns::callbacks> *)pmVar1,&local_38);
    local_40 = (void *)0x0;
    local_41 = true;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
    ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_40,&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            root_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (!ch) {
                    this->set_error (parser, error_code::expected_token);
                    return {nullptr, true};
                }

                switch (this->get_state ()) {
                case start_state:
                    this->set_state (new_token_state);
                    return {this->make_whitespace_matcher (parser), false};

                case new_token_state: {
                    if (object_key_ && *ch != '"') {
                        this->set_error (parser, error_code::expected_string);
                        // Don't return here in order to allow the switch default to produce a
                        // different error code for a bad token.
                    }
                    this->set_state (done_state);
                    switch (*ch) {
                    case '-':
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9':
                        return {this->template make_terminal_matcher<number_matcher<Callbacks>> (
                                    parser),
                                false};
                    case '"':
                        return {this->template make_terminal_matcher<string_matcher<Callbacks>> (
                                    parser, &parser.string_, object_key_),
                                false};
                    case 't':
                        return {
                            this->template make_terminal_matcher<true_token_matcher<Callbacks>> (
                                parser, "true"),
                            false};
                    case 'f':
                        return {
                            this->template make_terminal_matcher<false_token_matcher<Callbacks>> (
                                parser, "false"),
                            false};
                    case 'n':
                        return {
                            this->template make_terminal_matcher<null_token_matcher<Callbacks>> (
                                parser, "null"),
                            false};
                    case '[':
                        return {
                            typename matcher<Callbacks>::pointer (new array_matcher<Callbacks> ()),
                            false};
                    case '{':
                        return {
                            typename matcher<Callbacks>::pointer (new object_matcher<Callbacks> ()),
                            false};
                    default:
                        this->set_error (parser, error_code::expected_token);
                        return {nullptr, true};
                    }
                } break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                PSTORE_ASSERT (false); // unreachable.
                return {nullptr, true};
            }